

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O1

void __thiscall Assimp::M3DImporter::importTextures(M3DImporter *this,M3DWrapper *m3d)

{
  uint uVar1;
  ushort uVar2;
  ushort uVar3;
  m3dtx_t *pmVar4;
  long *plVar5;
  Logger *this_00;
  aiTexture **ppaVar6;
  m3d_t *pmVar7;
  aiTexture *paVar8;
  long *plVar9;
  aiTexel *paVar10;
  ulong uVar11;
  uint uVar12;
  long *plVar13;
  uint8_t *puVar14;
  ulong uVar15;
  size_t __n;
  ulong uVar16;
  allocator<char> local_499;
  M3DImporter *local_498;
  long *local_490;
  ulong local_488;
  long local_480;
  long lStack_478;
  M3DWrapper *local_470;
  m3dtx_t *local_468;
  ulong local_460;
  long *local_458 [2];
  long local_448 [2];
  undefined1 local_438 [1032];
  
  local_498 = this;
  if (this->mScene == (aiScene *)0x0) {
    __assert_fail("mScene != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x13c,"void Assimp::M3DImporter::importTextures(const M3DWrapper &)");
  }
  if (m3d->m3d_ == (m3d_t *)0x0) {
    __assert_fail("m3d",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x13d,"void Assimp::M3DImporter::importTextures(const M3DWrapper &)");
  }
  this->mScene->mNumTextures = m3d->m3d_->numtexture;
  this_00 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[21]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
             (char (*) [21])"M3D: importTextures ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_438);
  std::__cxx11::stringbuf::str();
  Logger::debug(this_00,(char *)local_490);
  if (local_490 != &local_480) {
    operator_delete(local_490,local_480 + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base((ios_base *)(local_438 + 0x70));
  uVar15 = (ulong)m3d->m3d_->numtexture;
  if (uVar15 != 0) {
    ppaVar6 = (aiTexture **)operator_new__(uVar15 << 3);
    local_498->mScene->mTextures = ppaVar6;
    pmVar7 = m3d->m3d_;
    if (pmVar7->numtexture != 0) {
      uVar15 = 0;
      local_470 = m3d;
      do {
        pmVar4 = pmVar7->texture;
        local_460 = uVar15;
        paVar8 = (aiTexture *)operator_new(0x428);
        paVar8->mWidth = 0;
        paVar8->mHeight = 0;
        paVar8->pcData = (aiTexel *)0x0;
        (paVar8->mFilename).length = 0;
        (paVar8->mFilename).data[0] = '\0';
        memset((paVar8->mFilename).data + 1,0x1b,0x3ff);
        paVar8->achFormatHint[0] = '\0';
        paVar8->achFormatHint[1] = '\0';
        paVar8->achFormatHint[2] = '\0';
        paVar8->achFormatHint[3] = '\0';
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_458,pmVar4[uVar15].name,&local_499);
        plVar9 = (long *)std::__cxx11::string::append((char *)local_458);
        plVar13 = plVar9 + 2;
        if ((long *)*plVar9 == plVar13) {
          local_480 = *plVar13;
          lStack_478 = plVar9[3];
          local_490 = &local_480;
        }
        else {
          local_480 = *plVar13;
          local_490 = (long *)*plVar9;
        }
        plVar5 = local_490;
        local_488 = plVar9[1];
        *plVar9 = (long)plVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        __n = local_488 & 0xffffffff;
        if ((local_488 & 0xfffffc00) != 0) {
          __n = 0x3ff;
        }
        local_468 = pmVar4;
        local_438._0_4_ = (ai_uint32)__n;
        memcpy(local_438 + 4,local_490,__n);
        local_438[__n + 4] = 0;
        (paVar8->mFilename).length = (ai_uint32)__n;
        memcpy((paVar8->mFilename).data,local_438 + 4,__n);
        (paVar8->mFilename).data[__n] = '\0';
        if (plVar5 != &local_480) {
          operator_delete(plVar5,local_480 + 1);
        }
        pmVar4 = local_468;
        if (local_458[0] != local_448) {
          operator_delete(local_458[0],local_448[0] + 1);
        }
        uVar2 = pmVar4[uVar15].w;
        if ((((uVar2 == 0) || (pmVar4[uVar15].h == 0)) || (pmVar4[uVar15].f == '\0')) ||
           (pmVar4[uVar15].d == (uint8_t *)0x0)) {
          paVar8->mWidth = 0;
          paVar8->mHeight = 0;
          builtin_strncpy(paVar8->achFormatHint,"png",4);
          paVar8->pcData = (aiTexel *)0x0;
        }
        else {
          paVar8->mWidth = (uint)uVar2;
          uVar3 = pmVar4[uVar15].h;
          paVar8->mHeight = (uint)uVar3;
          strcpy(paVar8->achFormatHint,
                 &DAT_006e3e78 +
                 *(int *)(m3d_commandtypes[0x25].a + (ulong)pmVar4[uVar15].f * 4 + 6));
          paVar10 = (aiTexel *)operator_new__((ulong)((uint)uVar3 * (uint)uVar2) << 2);
          paVar8->pcData = paVar10;
          if (paVar8->mHeight * paVar8->mWidth != 0) {
            uVar11 = 0;
            uVar12 = 0;
            do {
              switch(pmVar4[uVar15].f) {
              case '\x01':
                uVar16 = (ulong)uVar12;
                uVar12 = uVar12 + 1;
                paVar8->pcData[uVar11].g = pmVar4[uVar15].d[uVar16];
                break;
              case '\x02':
                uVar1 = uVar12 + 1;
                paVar8->pcData[uVar11].g = pmVar4[uVar15].d[uVar12];
                puVar14 = pmVar4[uVar15].d;
                uVar12 = uVar12 + 2;
                goto LAB_0046ef39;
              case '\x03':
                paVar8->pcData[uVar11].r = pmVar4[uVar15].d[uVar12];
                uVar1 = uVar12 + 2;
                paVar8->pcData[uVar11].g = pmVar4[uVar15].d[uVar12 + 1];
                uVar12 = uVar12 + 3;
                paVar8->pcData[uVar11].b = pmVar4[uVar15].d[uVar1];
                paVar8->pcData[uVar11].a = 0xff;
                break;
              case '\x04':
                paVar8->pcData[uVar11].r = pmVar4[uVar15].d[uVar12];
                paVar8->pcData[uVar11].g = pmVar4[uVar15].d[uVar12 + 1];
                uVar1 = uVar12 + 3;
                paVar8->pcData[uVar11].b = pmVar4[uVar15].d[uVar12 + 2];
                puVar14 = pmVar4[uVar15].d;
                uVar12 = uVar12 + 4;
LAB_0046ef39:
                paVar8->pcData[uVar11].a = puVar14[uVar1];
              }
              uVar11 = uVar11 + 1;
            } while (uVar11 < paVar8->mHeight * paVar8->mWidth);
          }
        }
        local_498->mScene->mTextures[local_460] = paVar8;
        uVar15 = local_460 + 1;
        pmVar7 = local_470->m3d_;
      } while (uVar15 < pmVar7->numtexture);
    }
  }
  return;
}

Assistant:

void M3DImporter::importTextures(const M3DWrapper &m3d) {
	unsigned int i;
	const char *formatHint[] = { "rgba0800", "rgba0808", "rgba8880", "rgba8888" };
	m3dtx_t *t;

	ai_assert(mScene != nullptr);
	ai_assert(m3d);

	mScene->mNumTextures = m3d->numtexture;
	ASSIMP_LOG_DEBUG_F("M3D: importTextures ", mScene->mNumTextures);

	if (!m3d->numtexture)
		return;

	mScene->mTextures = new aiTexture *[m3d->numtexture];
	for (i = 0; i < m3d->numtexture; i++) {
		unsigned int j, k;
		t = &m3d->texture[i];
		aiTexture *tx = new aiTexture;
		tx->mFilename = aiString(std::string(t->name) + ".png");
		if (!t->w || !t->h || !t->f || !t->d) {
			/* without ASSIMP_USE_M3D_READFILECB, we only have the filename, but no texture data ever */
			tx->mWidth = 0;
			tx->mHeight = 0;
			memcpy(tx->achFormatHint, "png\000", 4);
			tx->pcData = nullptr;
		} else {
			/* if we have the texture loaded, set format hint and pcData too */
			tx->mWidth = t->w;
			tx->mHeight = t->h;
			strcpy(tx->achFormatHint, formatHint[t->f - 1]);
			tx->pcData = new aiTexel[tx->mWidth * tx->mHeight];
			for (j = k = 0; j < tx->mWidth * tx->mHeight; j++) {
				switch (t->f) {
					case 1: tx->pcData[j].g = t->d[k++]; break;
					case 2:
						tx->pcData[j].g = t->d[k++];
						tx->pcData[j].a = t->d[k++];
						break;
					case 3:
						tx->pcData[j].r = t->d[k++];
						tx->pcData[j].g = t->d[k++];
						tx->pcData[j].b = t->d[k++];
						tx->pcData[j].a = 255;
						break;
					case 4:
						tx->pcData[j].r = t->d[k++];
						tx->pcData[j].g = t->d[k++];
						tx->pcData[j].b = t->d[k++];
						tx->pcData[j].a = t->d[k++];
						break;
				}
			}
		}
		mScene->mTextures[i] = tx;
	}
}